

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_memory_t * wasm_memory_new(wasm_store_t *store,wasm_memorytype_t *type)

{
  wasm_memorytype_t *store_00;
  wasm_memory_t *this;
  MemoryType *pMVar1;
  MemoryType local_58;
  Ptr local_30;
  wasm_memorytype_t *local_18;
  wasm_memorytype_t *type_local;
  wasm_store_t *store_local;
  
  local_18 = type;
  type_local = (wasm_memorytype_t *)store;
  fprintf(_stderr,"CAPI: [%s] \n","wasm_memory_new");
  this = (wasm_memory_t *)operator_new(0x18);
  store_00 = type_local;
  pMVar1 = wasm_externtype_t::As<wabt::interp::MemoryType>(&local_18->super_wasm_externtype_t);
  wabt::interp::MemoryType::MemoryType(&local_58,pMVar1);
  wabt::interp::Memory::New(&local_30,(Store *)store_00,&local_58);
  wasm_memory_t::wasm_memory_t(this,&local_30);
  wabt::interp::RefPtr<wabt::interp::Memory>::~RefPtr(&local_30);
  wabt::interp::MemoryType::~MemoryType(&local_58);
  return this;
}

Assistant:

own wasm_memory_t* wasm_memory_new(wasm_store_t* store,
                                   const wasm_memorytype_t* type) {
  TRACE0();
  return new wasm_memory_t{Memory::New(store->I, *type->As<MemoryType>())};
}